

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenInitializer::RccListInputs
          (cmQtAutoGenInitializer *this,string *fileName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *error)

{
  uint uVar1;
  bool bVar2;
  int retVal;
  string rccStdOut;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  string rccStdErr;
  string fileNameName;
  string fileDir;
  int local_41c;
  string local_418;
  undefined1 local_3f8 [40];
  string local_3d0;
  string local_3b0 [3];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  uint auStack_218 [122];
  
  bVar2 = cmsys::SystemTools::FileExists(fileName);
  if (bVar2) {
    if (((this->Rcc).super_GenVarsT.ExecutableExists == true) &&
       ((this->Rcc).ListOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Rcc).ListOptions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      if ((this->Rcc).super_GenVarsT.Executable._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x4e6018);
        return false;
      }
      cmsys::SystemTools::GetFilenamePath((string *)local_238,fileName);
      cmsys::SystemTools::GetFilenameName(local_3b0,fileName);
      local_41c = 0;
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      local_418._M_string_length = 0;
      local_418.field_2._M_local_buf[0] = '\0';
      local_3d0._M_string_length = 0;
      local_3d0.field_2._M_local_buf[0] = '\0';
      local_3f8._16_8_ = (pointer)0x0;
      local_3f8._0_8_ = (pointer)0x0;
      local_3f8._8_8_ = (pointer)0x0;
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3f8,&(this->Rcc).super_GenVarsT.Executable);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_3f8,
                 local_3f8._8_8_,
                 (this->Rcc).ListOptions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->Rcc).ListOptions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3f8,local_3b0);
      bVar2 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3f8,&local_418,&local_3d0,&local_41c,(char *)local_238._0_8_,
                         OUTPUT_NONE,(cmDuration)0x0,Auto);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3f8);
      if (bVar2 && local_41c == 0) {
        bVar2 = cmQtAutoGen::RccListParseOutput(&local_418,&local_3d0,files,error);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x4e6035);
        cmQtAutoGen::Quoted((string *)local_3f8,fileName);
        std::__cxx11::string::_M_append((char *)error,local_3f8._0_8_);
        if ((pointer)local_3f8._0_8_ != (pointer)(local_3f8 + 0x10)) {
          operator_delete((void *)local_3f8._0_8_,(ulong)(local_3f8._16_8_ + 1));
        }
        std::__cxx11::string::append((char *)error);
        std::__cxx11::string::_M_append((char *)error,(ulong)local_418._M_dataplus._M_p);
        std::__cxx11::string::append((char *)error);
        std::__cxx11::string::_M_append((char *)error,(ulong)local_3d0._M_dataplus._M_p);
        std::__cxx11::string::append((char *)error);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,
                        CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                                 local_3d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p,local_3b0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
      }
      if (bVar2 == false) goto LAB_001e5f8c;
    }
    else {
      local_418._M_string_length = 0;
      local_418.field_2._M_local_buf[0] = '\0';
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::ifstream::ifstream(local_238,(fileName->_M_dataplus)._M_p,_S_in);
      uVar1 = *(uint *)((long)auStack_218 + *(long *)(local_238._0_8_ + -0x18));
      if ((uVar1 & 5) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::ostream::operator<<(local_3b0,(streambuf *)(local_238 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_418,(string *)&local_3d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
          operator_delete(local_3d0._M_dataplus._M_p,
                          CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                                   local_3d0.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x4e6055);
        cmQtAutoGen::Quoted(local_3b0,fileName);
        std::__cxx11::string::_M_append((char *)error,(ulong)local_3b0[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p,
                          local_3b0[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)error);
      }
      std::ifstream::~ifstream(local_238);
      if ((uVar1 & 5) == 0) {
        cmQtAutoGen::RccListParseContent(&local_418,files);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
      if ((uVar1 & 5) != 0) goto LAB_001e5f8c;
    }
    cmsys::SystemTools::GetFilenamePath((string *)local_238,fileName);
    cmQtAutoGen::RccListConvertFullPath((string *)local_238,files);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    bVar2 = true;
  }
  else {
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x4e5ff3);
    cmQtAutoGen::Quoted((string *)local_238,fileName);
    std::__cxx11::string::_M_append((char *)error,local_238._0_8_);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)error);
LAB_001e5f8c:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenInitializer::RccListInputs(std::string const& fileName,
                                           std::vector<std::string>& files,
                                           std::string& error)
{
  if (!cmSystemTools::FileExists(fileName)) {
    error = "rcc resource file does not exist:\n  ";
    error += Quoted(fileName);
    error += "\n";
    return false;
  }
  if (this->Rcc.ExecutableExists && !this->Rcc.ListOptions.empty()) {
    // Use rcc for file listing
    if (this->Rcc.Executable.empty()) {
      error = "rcc executable not available";
      return false;
    }

    // Run rcc list command in the directory of the qrc file with the
    // pathless
    // qrc file name argument. This way rcc prints relative paths.
    // This avoids issues on Windows when the qrc file is in a path that
    // contains non-ASCII characters.
    std::string const fileDir = cmSystemTools::GetFilenamePath(fileName);
    std::string const fileNameName = cmSystemTools::GetFilenameName(fileName);

    bool result = false;
    int retVal = 0;
    std::string rccStdOut;
    std::string rccStdErr;
    {
      std::vector<std::string> cmd;
      cmd.push_back(this->Rcc.Executable);
      cmd.insert(cmd.end(), this->Rcc.ListOptions.begin(),
                 this->Rcc.ListOptions.end());
      cmd.push_back(fileNameName);
      result = cmSystemTools::RunSingleCommand(
        cmd, &rccStdOut, &rccStdErr, &retVal, fileDir.c_str(),
        cmSystemTools::OUTPUT_NONE, cmDuration::zero(), cmProcessOutput::Auto);
    }
    if (!result || retVal) {
      error = "rcc list process failed for:\n  ";
      error += Quoted(fileName);
      error += "\n";
      error += rccStdOut;
      error += "\n";
      error += rccStdErr;
      error += "\n";
      return false;
    }
    if (!RccListParseOutput(rccStdOut, rccStdErr, files, error)) {
      return false;
    }
  } else {
    // We can't use rcc for the file listing.
    // Read the qrc file content into string and parse it.
    {
      std::string qrcContents;
      {
        cmsys::ifstream ifs(fileName.c_str());
        if (ifs) {
          std::ostringstream osst;
          osst << ifs.rdbuf();
          qrcContents = osst.str();
        } else {
          error = "rcc file not readable:\n  ";
          error += Quoted(fileName);
          error += "\n";
          return false;
        }
      }
      // Parse string content
      RccListParseContent(qrcContents, files);
    }
  }

  // Convert relative paths to absolute paths
  RccListConvertFullPath(cmSystemTools::GetFilenamePath(fileName), files);
  return true;
}